

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.h
# Opt level: O0

void __thiscall GdlSetAttrItem::GdlSetAttrItem(GdlSetAttrItem *this,GdlSetAttrItem *rit)

{
  size_type_conflict sVar1;
  vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *this_00;
  long in_RSI;
  GdlRuleItem *in_RDI;
  size_t i;
  GdlRuleItem *__x;
  GdlRuleItem *in_stack_ffffffffffffffd0;
  ulong local_18;
  
  GdlRuleItem::GdlRuleItem(in_stack_ffffffffffffffd0,in_RDI);
  in_RDI->_vptr_GdlRuleItem = (_func_int **)&PTR_Clone_0036c4f0;
  std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::vector
            ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)0x1a6b43);
  *(undefined4 *)&in_RDI[1].super_GdlObject.m_lnf.field_0x10 = 0xffffffff;
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::size
                      ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                       (in_RSI + 0x78));
    if (sVar1 <= local_18) break;
    __x = in_RDI + 1;
    this_00 = (vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)operator_new(0x48);
    std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
              ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)(in_RSI + 0x78),
               local_18);
    GdlAttrValueSpec::GdlAttrValueSpec
              ((GdlAttrValueSpec *)in_stack_ffffffffffffffd0,(GdlAttrValueSpec *)in_RDI);
    std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
              (this_00,(value_type *)__x);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

GdlSetAttrItem(const GdlSetAttrItem & rit)
		:	GdlRuleItem(rit)
	{
		m_nAttachTo = -1;
		Assert(m_vpavs.size() == 0);
		for (size_t i = 0; i < rit.m_vpavs.size(); ++i)
			m_vpavs.push_back(new GdlAttrValueSpec(*rit.m_vpavs[i]));
	}